

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O3

void fct_junit_logger__on_test_suite_end(fct_logger_i *logger_,fct_logger_evt_t *e)

{
  fct_ts_t *ts;
  void *pvVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  bool bVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  size_t sVar11;
  char *pcVar12;
  ulong uVar13;
  double dVar14;
  char std_buffer [1024];
  undefined1 local_438 [1032];
  
  iVar6 = fct_saved_stdout;
  ts = e->ts;
  if (ts == (fct_ts_t *)0x0) {
    __assert_fail("ts != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x54e
                  ,"double fct_ts__duration(const fct_ts_t *)");
  }
  sVar8 = (ts->test_list).used_itm_num;
  if (sVar8 == 0) {
    dVar14 = 0.0;
  }
  else {
    dVar14 = 0.0;
    sVar11 = 0;
    do {
      pvVar1 = (ts->test_list).itm_list[sVar11];
      if (pvVar1 == (void *)0x0) {
        __assert_fail("test != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x3f9,"double fct_test__duration(const fct_test_t *)");
      }
      dVar14 = dVar14 + *(double *)((long)pvVar1 + 0x40);
      sVar11 = sVar11 + 1;
    } while (sVar8 != sVar11);
  }
  fflush(_stdout);
  dup2(iVar6,1);
  iVar6 = fct_saved_stderr;
  fflush(_stderr);
  dup2(iVar6,2);
  sVar8 = fct_ts__tst_cnt(ts);
  sVar11 = fct_ts__tst_cnt_passed(ts);
  sVar9 = fct_ts__tst_cnt(ts);
  printf("\t<testsuite errors=\"%lu\" failures=\"0\" tests=\"%lu\" name=\"%s\" time=\"%.4f\">\n",
         dVar14,sVar8 - sVar11,sVar9);
  sVar8 = (ts->test_list).used_itm_num;
  if (sVar8 != 0) {
    uVar10 = 0;
    do {
      if ((ts->test_list).used_itm_num <= uVar10) {
LAB_00103a4d:
        __assert_fail("idx < list->used_itm_num",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x322,"void *fct_nlist__at(const fct_nlist_t *, size_t)");
      }
      plVar2 = (long *)(ts->test_list).itm_list[uVar10];
      if (plVar2 == (long *)0x0) {
        __assert_fail("test != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x401,"int fct_test__is_pass(const fct_test_t *)");
      }
      lVar3 = plVar2[2];
      pcVar12 = "\t\t<testcase name=\"%s\" time=\"%.3f\">\n";
      if (lVar3 == 0) {
        pcVar12 = "\t\t<testcase name=\"%s\" time=\"%.3f\"";
      }
      printf(pcVar12,plVar2[8],plVar2 + 9);
      uVar4 = plVar2[2];
      if (uVar4 != 0) {
        uVar13 = 0;
        do {
          if ((ulong)plVar2[2] <= uVar13) goto LAB_00103a4d;
          lVar5 = *(long *)(*plVar2 + uVar13 * 8);
          printf("\t\t\t<error message=\"%s\" type=\"fctx\">",lVar5 + 0x208);
          printf("file:%s, line:%d",lVar5 + 0x100,(ulong)*(uint *)(lVar5 + 0x200));
          puts("</error>");
          uVar13 = uVar13 + 1;
        } while (uVar4 != uVar13);
      }
      pcVar12 = "\t\t</testcase>";
      if (lVar3 == 0) {
        pcVar12 = " />";
      }
      puts(pcVar12);
      uVar10 = uVar10 + 1;
    } while (uVar10 != sVar8);
  }
  printf("\t\t<system-out>\n\t\t\t<![CDATA[");
  uVar10 = read(fct_stdout_pipe[0],local_438,0x400);
  if (0 < (int)uVar10) {
    bVar7 = false;
    do {
      if (!bVar7) {
        putchar(10);
      }
      printf("%.*s",uVar10 & 0xffffffff,local_438);
      uVar10 = read(fct_stdout_pipe[0],local_438,0x400);
      bVar7 = true;
    } while (0 < (int)uVar10);
  }
  puts("]]>\n\t\t</system-out>");
  printf("\t\t<system-err>\n\t\t\t<![CDATA[");
  uVar10 = read(fct_stderr_pipe[0],local_438,0x400);
  if (0 < (int)uVar10) {
    bVar7 = false;
    do {
      if (!bVar7) {
        putchar(10);
      }
      printf("%.*s",uVar10 & 0xffffffff,local_438);
      uVar10 = read(fct_stderr_pipe[0],local_438,0x400);
      bVar7 = true;
    } while (0 < (int)uVar10);
  }
  puts("]]>\n\t\t</system-err>");
  puts("\t</testsuite>");
  return;
}

Assistant:

static void
fct_junit_logger__on_test_suite_end(
    fct_logger_i *logger_,
    fct_logger_evt_t const *e
)
{
    fct_ts_t const *ts = e->ts; /* Test Suite */
    nbool_t is_pass;
    double elasped_time = 0;
    char std_buffer[1024];
    int read_length;
    int first_out_line;

    fct_unused(logger_);

    elasped_time = fct_ts__duration(ts);

    FCT_SWITCH_STDOUT_TO_STDOUT();
    FCT_SWITCH_STDERR_TO_STDERR();

    /* opening testsuite tag */
    printf("\t<testsuite errors=\"%lu\" failures=\"0\" tests=\"%lu\" "
           "name=\"%s\" time=\"%.4f\">\n",
           (unsigned long)   fct_ts__tst_cnt(ts)
           - fct_ts__tst_cnt_passed(ts),
           (unsigned long) fct_ts__tst_cnt(ts),
           fct_ts__name(ts),
           elasped_time);

    FCT_NLIST_FOREACH_BGN(fct_test_t*, test, &(ts->test_list))
    {
        is_pass = fct_test__is_pass(test);

        /* opening testcase tag */
        if (is_pass)
        {
            printf("\t\t<testcase name=\"%s\" time=\"%.3f\"",
                   fct_test__name(test),
                   fct_test__duration(test)
                  );
        }
        else
        {
            printf("\t\t<testcase name=\"%s\" time=\"%.3f\">\n",
                   fct_test__name(test),
                   fct_test__duration(test)
                  );
        }

        FCT_NLIST_FOREACH_BGN(fctchk_t*, chk, &(test->failed_chks))
        {
            /* error tag */
            printf("\t\t\t<error message=\"%s\" "
                   "type=\"fctx\">", chk->msg);
            printf("file:%s, line:%d", chk->file, chk->lineno);
            printf("</error>\n");
        }
        FCT_NLIST_FOREACH_END();

        /* closing testcase tag */
        if (is_pass)
        {
            printf(" />\n");
        }
        else
        {
            printf("\t\t</testcase>\n");
        }
    }
    FCT_NLIST_FOREACH_END();

    /* print the std streams */
    first_out_line = 1;
    printf("\t\t<system-out>\n\t\t\t<![CDATA[");
    while ( (read_length = _fct_read(fct_stdout_pipe[0], std_buffer, 1024)) > 0)
    {
        if (first_out_line)
        {
            printf("\n");
            first_out_line = 0;
        }
        printf("%.*s", read_length, std_buffer);
    }
    printf("]]>\n\t\t</system-out>\n");

    first_out_line = 1;
    printf("\t\t<system-err>\n\t\t\t<![CDATA[");
    while ((read_length = _fct_read(fct_stderr_pipe[0], std_buffer, 1024)) > 0)
    {
        if (first_out_line)
        {
            printf("\n");
            first_out_line = 0;
        }
        printf("%.*s", read_length, std_buffer);
    }
    printf("]]>\n\t\t</system-err>\n");

    /* closing testsuite tag */
    printf("\t</testsuite>\n");
}